

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_fold.c
# Opt level: O0

uint32_t nexttoken(char **pp,int allowlit,int allowany)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uint local_44;
  uint32_t j;
  char *r;
  char *q;
  char *pcStack_28;
  uint32_t i;
  char *p;
  int allowany_local;
  int allowlit_local;
  char **pp_local;
  
  pcStack_28 = *pp;
  if (pcStack_28 == (char *)0x0) {
    return 0;
  }
  pcVar3 = strchr(pcStack_28,0x20);
  r = pcVar3;
  if (pcVar3 != (char *)0x0) {
    r = pcVar3 + 1;
    *pcVar3 = '\0';
  }
  *pp = r;
  if ((allowlit == 0) || (iVar2 = strncmp(pcStack_28,"IRFPM_",6), iVar2 != 0)) {
    if ((allowlit == 0) || (iVar2 = strncmp(pcStack_28,"IRFL_",5), iVar2 != 0)) {
      if ((allowlit == 0) || (iVar2 = strncmp(pcStack_28,"IRCALL_",7), iVar2 != 0)) {
        if ((allowlit == 0) || (iVar2 = strncmp(pcStack_28,"IRCONV_",7), iVar2 != 0)) {
          if (((allowlit == 0) || (*pcStack_28 < '0')) || ('9' < *pcStack_28)) {
            if ((allowany != 0) && (iVar2 = strcmp("any",pcStack_28), iVar2 == 0)) {
              return allowany;
            }
            for (q._4_4_ = 0; ir_names[q._4_4_] != (char *)0x0; q._4_4_ = q._4_4_ + 1) {
              iVar2 = strcmp(ir_names[q._4_4_],pcStack_28);
              if (iVar2 == 0) {
                return q._4_4_;
              }
            }
          }
          else {
            q._4_4_ = 0;
            while( true ) {
              bVar1 = false;
              if ('/' < *pcStack_28) {
                bVar1 = *pcStack_28 < ':';
              }
              if (!bVar1) break;
              q._4_4_ = q._4_4_ * 10 + *pcStack_28 + -0x30;
              pcStack_28 = pcStack_28 + 1;
            }
            if (*pcStack_28 == '\0') {
              return q._4_4_;
            }
          }
        }
        else {
          for (q._4_4_ = 0; irt_names[q._4_4_] != (char *)0x0; q._4_4_ = q._4_4_ + 1) {
            pcVar3 = strchr(pcStack_28 + 7,0x5f);
            if ((pcVar3 != (char *)0x0) &&
               (iVar2 = strncmp(irt_names[q._4_4_],pcStack_28 + 7,
                                (long)pcVar3 - (long)(pcStack_28 + 7)), iVar2 == 0)) {
              for (local_44 = 0; irt_names[local_44] != (char *)0x0; local_44 = local_44 + 1) {
                iVar2 = strcmp(irt_names[local_44],pcVar3 + 1);
                if (iVar2 == 0) {
                  return q._4_4_ * 0x20 + local_44;
                }
              }
            }
          }
        }
      }
      else {
        for (q._4_4_ = 0; ircall_names[q._4_4_] != (char *)0x0; q._4_4_ = q._4_4_ + 1) {
          iVar2 = strcmp(ircall_names[q._4_4_],pcStack_28 + 7);
          if (iVar2 == 0) {
            return q._4_4_;
          }
        }
      }
    }
    else {
      for (q._4_4_ = 0; irfield_names[q._4_4_] != (char *)0x0; q._4_4_ = q._4_4_ + 1) {
        iVar2 = strcmp(irfield_names[q._4_4_],pcStack_28 + 5);
        if (iVar2 == 0) {
          return q._4_4_;
        }
      }
    }
  }
  else {
    for (q._4_4_ = 0; irfpm_names[q._4_4_] != (char *)0x0; q._4_4_ = q._4_4_ + 1) {
      iVar2 = strcmp(irfpm_names[q._4_4_],pcStack_28 + 6);
      if (iVar2 == 0) {
        return q._4_4_;
      }
    }
  }
  fprintf(_stderr,"Error: bad fold definition token \"%s\" at line %d\n",pcStack_28,
          (ulong)(uint)lineno);
  exit(1);
}

Assistant:

static uint32_t nexttoken(char **pp, int allowlit, int allowany)
{
  char *p = *pp;
  if (p) {
    uint32_t i;
    char *q = strchr(p, ' ');
    if (q) *q++ = '\0';
    *pp = q;
    if (allowlit && !strncmp(p, "IRFPM_", 6)) {
      for (i = 0; irfpm_names[i]; i++)
	if (!strcmp(irfpm_names[i], p+6))
	  return i;
    } else if (allowlit && !strncmp(p, "IRFL_", 5)) {
      for (i = 0; irfield_names[i]; i++)
	if (!strcmp(irfield_names[i], p+5))
	  return i;
    } else if (allowlit && !strncmp(p, "IRCALL_", 7)) {
      for (i = 0; ircall_names[i]; i++)
	if (!strcmp(ircall_names[i], p+7))
	  return i;
    } else if (allowlit && !strncmp(p, "IRCONV_", 7)) {
      for (i = 0; irt_names[i]; i++) {
	const char *r = strchr(p+7, '_');
	if (r && !strncmp(irt_names[i], p+7, r-(p+7))) {
	  uint32_t j;
	  for (j = 0; irt_names[j]; j++)
	    if (!strcmp(irt_names[j], r+1))
	      return (i << 5) + j;
	}
      }
    } else if (allowlit && *p >= '0' && *p <= '9') {
      for (i = 0; *p >= '0' && *p <= '9'; p++)
	i = i*10 + (*p - '0');
      if (*p == '\0')
	return i;
    } else if (allowany && !strcmp("any", p)) {
      return allowany;
    } else {
      for (i = 0; ir_names[i]; i++)
	if (!strcmp(ir_names[i], p))
	  return i;
    }
    fprintf(stderr, "Error: bad fold definition token \"%s\" at line %d\n", p, lineno);
    exit(1);
  }
  return 0;
}